

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

VariableID __thiscall spirv_cross::CompilerHLSL::remap_num_workgroups_builtin(CompilerHLSL *this)

{
  ID id;
  uint32_t uVar1;
  SPIRType *pSVar2;
  mapped_type *pmVar3;
  uint32_t block_pointer_type_id;
  SPIRType block_type;
  SPIRType uint_type;
  SPIRType block_pointer_type;
  uint32_t local_428;
  key_type local_424;
  undefined1 local_420 [192];
  uint *local_360;
  size_t sStack_358;
  size_t local_350;
  uint local_348 [8];
  TypeID local_328;
  undefined8 local_310;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_308;
  undefined1 local_2d0 [192];
  uint *local_210;
  size_t sStack_208;
  size_t local_200;
  uint local_1f8 [8];
  TypeID local_1d8;
  undefined8 local_1c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [15];
  TypeID local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  Compiler::update_active_builtins((Compiler *)this);
  uVar1 = 0;
  if (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower & 0x1000000) != 0) {
    uVar1 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,4);
    local_428 = uVar1 + 2;
    local_2d0._32_8_ = local_2d0 + 0x38;
    local_2d0._8_4_ = 0;
    local_2d0._0_8_ = &PTR__SPIRType_0035b448;
    local_2d0._40_8_ = 0;
    local_2d0._48_8_ = 8;
    local_2d0._88_8_ = local_2d0 + 0x70;
    local_2d0._96_8_ = 0;
    local_2d0._104_8_ = 8;
    local_2d0._120_4_ = 0;
    local_2d0[0x7c] = false;
    local_2d0[0x7d] = false;
    local_2d0._128_4_ = StorageClassGeneric;
    local_2d0._136_8_ = local_2d0 + 0xa0;
    local_2d0._144_8_ = 0;
    local_2d0._152_8_ = 8;
    local_210 = local_1f8;
    sStack_208 = 0;
    local_200 = 8;
    local_1d8.id = 0;
    local_1c0._0_4_ = 0;
    local_1c0._4_4_ = 0;
    local_1b8._M_buckets = &local_1b8._M_single_bucket;
    local_1b8._M_bucket_count = 1;
    local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b8._M_element_count = 0;
    local_1b8._M_rehash_policy._M_max_load_factor = 1.0;
    local_1b8._M_rehash_policy._M_next_resize = 0;
    local_1b8._M_single_bucket = (__node_base_ptr)0x0;
    local_2d0._12_8_ = 0x2000000008;
    local_2d0._20_4_ = 3;
    local_2d0._24_4_ = 1;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,uVar1,(SPIRType *)local_2d0);
    id.id = uVar1 + 1;
    local_420._32_8_ = local_420 + 0x38;
    local_420._8_4_ = 0;
    local_420._0_8_ = &PTR__SPIRType_0035b448;
    local_420._20_4_ = 1;
    local_420._24_4_ = 1;
    local_420._40_8_ = 0;
    local_420._48_8_ = 8;
    local_420._88_8_ = local_420 + 0x70;
    local_420._96_8_ = 0;
    local_420._104_8_ = 8;
    local_420._120_4_ = 0;
    local_420[0x7c] = false;
    local_420[0x7d] = false;
    local_420._128_4_ = StorageClassGeneric;
    local_420._136_8_ = local_420 + 0xa0;
    local_420._144_8_ = 0;
    local_420._152_8_ = 8;
    sStack_358 = 0;
    local_350 = 8;
    local_328.id = 0;
    local_310._0_4_ = 0;
    local_310._4_4_ = 0;
    local_308._M_buckets = &local_308._M_single_bucket;
    local_308._M_bucket_count = 1;
    local_308._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_308._M_element_count = 0;
    local_308._M_rehash_policy._M_max_load_factor = 1.0;
    local_308._M_rehash_policy._M_next_resize = 0;
    local_308._M_single_bucket = (__node_base_ptr)0x0;
    local_420._12_8_ = 0xf;
    local_360 = local_348;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_420 + 0x88),1
              );
    ((TypedID<(spirv_cross::Types)1> *)(local_420._136_8_ + local_420._144_8_ * 4))->id = uVar1;
    local_420._144_8_ = local_420._144_8_ + 1;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,id.id,(SPIRType *)local_420);
    Compiler::set_decoration((Compiler *)this,id,DecorationBlock,0);
    local_180._0_8_ = local_180 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"count","");
    Compiler::set_member_name((Compiler *)this,(TypeID)id.id,0,(string *)local_180);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_);
    }
    Compiler::set_member_decoration((Compiler *)this,(TypeID)id.id,0,DecorationOffset,0);
    SPIRType::SPIRType((SPIRType *)local_180,(SPIRType *)local_420);
    local_180[0x7c] = true;
    local_180._128_4_ = StorageClassUniform;
    local_6c.id = id.id;
    pSVar2 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                       ((Compiler *)this,local_428,(SPIRType *)local_180);
    uVar1 = uVar1 + 3;
    (pSVar2->super_IVariant).self.id = id.id;
    local_424.id = 2;
    Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
              ((Compiler *)this,uVar1,&local_428,&local_424.id);
    local_424.id = uVar1;
    pmVar3 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_424);
    ::std::__cxx11::string::_M_replace
              ((ulong)pmVar3,0,(char *)(pmVar3->decoration).alias._M_string_length,0x2e8c0c);
    this->num_workgroups_builtin = uVar1;
    local_180._0_8_ = &PTR__SPIRType_0035b448;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_180._144_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
      free((void *)local_180._136_8_);
    }
    local_180._96_8_ = 0;
    if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
      free((void *)local_180._88_8_);
    }
    local_180._40_8_ = 0;
    if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
      free((void *)local_180._32_8_);
    }
    local_420._0_8_ = &PTR__SPIRType_0035b448;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_308);
    sStack_358 = 0;
    if (local_360 != local_348) {
      free(local_360);
    }
    local_420._144_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_420._136_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_420 + 0xa0)) {
      free((void *)local_420._136_8_);
    }
    local_420._96_8_ = 0;
    if ((undefined1 *)local_420._88_8_ != local_420 + 0x70) {
      free((void *)local_420._88_8_);
    }
    local_420._40_8_ = 0;
    if ((undefined1 *)local_420._32_8_ != local_420 + 0x38) {
      free((void *)local_420._32_8_);
    }
    local_2d0._0_8_ = &PTR__SPIRType_0035b448;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1b8);
    sStack_208 = 0;
    if (local_210 != local_1f8) {
      free(local_210);
    }
    local_2d0._144_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_2d0._136_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_2d0 + 0xa0)) {
      free((void *)local_2d0._136_8_);
    }
    local_2d0._96_8_ = 0;
    if ((undefined1 *)local_2d0._88_8_ != local_2d0 + 0x70) {
      free((void *)local_2d0._88_8_);
    }
    local_2d0._40_8_ = 0;
    if ((undefined1 *)local_2d0._32_8_ != local_2d0 + 0x38) {
      free((void *)local_2d0._32_8_);
    }
  }
  return (VariableID)uVar1;
}

Assistant:

VariableID CompilerHLSL::remap_num_workgroups_builtin()
{
	update_active_builtins();

	if (!active_input_builtins.get(BuiltInNumWorkgroups))
		return 0;

	// Create a new, fake UBO.
	uint32_t offset = ir.increase_bound_by(4);

	uint32_t uint_type_id = offset;
	uint32_t block_type_id = offset + 1;
	uint32_t block_pointer_type_id = offset + 2;
	uint32_t variable_id = offset + 3;

	SPIRType uint_type;
	uint_type.basetype = SPIRType::UInt;
	uint_type.width = 32;
	uint_type.vecsize = 3;
	uint_type.columns = 1;
	set<SPIRType>(uint_type_id, uint_type);

	SPIRType block_type;
	block_type.basetype = SPIRType::Struct;
	block_type.member_types.push_back(uint_type_id);
	set<SPIRType>(block_type_id, block_type);
	set_decoration(block_type_id, DecorationBlock);
	set_member_name(block_type_id, 0, "count");
	set_member_decoration(block_type_id, 0, DecorationOffset, 0);

	SPIRType block_pointer_type = block_type;
	block_pointer_type.pointer = true;
	block_pointer_type.storage = StorageClassUniform;
	block_pointer_type.parent_type = block_type_id;
	auto &ptr_type = set<SPIRType>(block_pointer_type_id, block_pointer_type);

	// Preserve self.
	ptr_type.self = block_type_id;

	set<SPIRVariable>(variable_id, block_pointer_type_id, StorageClassUniform);
	ir.meta[variable_id].decoration.alias = "SPIRV_Cross_NumWorkgroups";

	num_workgroups_builtin = variable_id;
	return variable_id;
}